

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int re_compile_and_match
              (re_context *ctx,char *pattern,size_t patlen,char *searchstr,size_t searchlen)

{
  re_status_t rVar1;
  re_pattern_buffer *in_RDI;
  re_context *in_R8;
  re_machine machine;
  re_machine *in_stack_00000430;
  size_t in_stack_00000438;
  char *in_stack_00000440;
  re_context *in_stack_00000448;
  char *in_stack_ffffffffffffffc8;
  int local_4;
  
  rVar1 = re_compile(in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000430);
  if (rVar1 == RE_STATUS_SUCCESS) {
    re_save_search_str(in_R8,in_stack_ffffffffffffffc8,0x1529e7);
    memset(&in_RDI->fastmap,0,0xa0);
    local_4 = re_match(in_RDI,(char *)in_RDI[3].buffer,(int)in_RDI[3].buffer,
                       (int)in_RDI[3].allocated,(re_registers *)&stack0xffffffffffffffc8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int re_compile_and_match(re_context *ctx,
                         const char *pattern, size_t patlen,
                         const char *searchstr, size_t searchlen)
{
    re_machine machine;

    /* compile the expression - return failure if we get an error */
    if (re_compile(ctx, pattern, patlen, &machine) != RE_STATUS_SUCCESS)
        return FALSE;

    /* save the search string in our internal buffer */
    re_save_search_str(ctx, searchstr, searchlen);

    /* clear the group registers */
    memset(ctx->regs, 0, sizeof(ctx->regs));

    /* match the string */
    return re_match(ctx, ctx->strbuf, ctx->strbuf, ctx->curlen,
                    &machine, ctx->regs);
}